

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

void doTest(int w,int h,int *formats,int nformats,int subsamp,char *basename)

{
  char *pcVar1;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  int in_R8D;
  int unaff_retaddr;
  int flags;
  int i;
  int pf;
  int pfi;
  unsigned_long size;
  uchar *dstBuf;
  tjhandle dhandle;
  tjhandle chandle;
  int in_stack_000003f4;
  int in_stack_000003f8;
  int in_stack_000003fc;
  unsigned_long *in_stack_00000400;
  uchar **in_stack_00000408;
  tjhandle in_stack_00000410;
  char *in_stack_00000430;
  int in_stack_00000438;
  int in_stack_00000440;
  int in_stack_00000448;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint local_50;
  int pf_00;
  int h_00;
  int w_00;
  unsigned_long jpegSize;
  uchar *jpegBuf;
  tjhandle handle;
  tjhandle local_28;
  
  local_28 = (tjhandle)0x0;
  handle = (tjhandle)0x0;
  jpegBuf = (uchar *)0x0;
  jpegSize = 0;
  if (alloc == 0) {
    jpegSize = tjBufSize(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
  }
  if ((jpegSize == 0) || (jpegBuf = tjAlloc(0), jpegBuf != (uchar *)0x0)) {
    local_28 = tjInitCompress();
    if ((local_28 == (tjhandle)0x0) || (handle = tjInitDecompress(), handle == (tjhandle)0x0)) {
      pcVar1 = tjGetErrorStr();
      printf("TurboJPEG ERROR:\n%s\n",pcVar1);
      exitStatus = -1;
    }
    else {
      for (w_00 = 0; w_00 < in_ECX; w_00 = w_00 + 1) {
        for (pf_00 = 0; pf_00 < 2; pf_00 = pf_00 + 1) {
          local_50 = 0;
          if ((((in_R8D == 1) || (in_R8D == 2)) || (in_R8D == 4)) || (in_R8D == 5)) {
            local_50 = 0x100;
          }
          if (pf_00 == 1) {
            local_50 = local_50 | 2;
          }
          h_00 = *(int *)(in_RDX + (long)w_00 * 4);
          compTest(in_stack_00000410,in_stack_00000408,in_stack_00000400,in_stack_000003fc,
                   in_stack_000003f8,in_stack_000003f4,in_stack_00000430,in_stack_00000438,
                   in_stack_00000440,in_stack_00000448);
          in_stack_ffffffffffffff98 = local_50;
          decompTest(handle,jpegBuf,jpegSize,w_00,h_00,pf_00,in_RDX,in_ESI,unaff_retaddr);
          if ((1 < h_00) && (h_00 < 6)) {
            printf("\n");
            decompTest(handle,jpegBuf,jpegSize,w_00,h_00,pf_00,in_RDX,in_ESI,unaff_retaddr);
            in_stack_ffffffffffffff98 = local_50;
          }
          printf("\n");
        }
      }
      printf("--------------------\n\n");
    }
  }
  else {
    printf("ERROR: %s\n","Memory allocation failure.");
    exitStatus = -1;
  }
  if (local_28 != (tjhandle)0x0) {
    tjDestroy((tjhandle)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (handle != (tjhandle)0x0) {
    tjDestroy((tjhandle)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  tjFree((uchar *)0x106ee4);
  return;
}

Assistant:

static void doTest(int w, int h, const int *formats, int nformats, int subsamp,
                   char *basename)
{
  tjhandle chandle = NULL, dhandle = NULL;
  unsigned char *dstBuf = NULL;
  unsigned long size = 0;
  int pfi, pf, i;

  if (!alloc)
    size = tjBufSize(w, h, subsamp);
  if (size != 0)
    if ((dstBuf = (unsigned char *)tjAlloc(size)) == NULL)
      THROW("Memory allocation failure.");

  if ((chandle = tjInitCompress()) == NULL ||
      (dhandle = tjInitDecompress()) == NULL)
    THROW_TJ();

  for (pfi = 0; pfi < nformats; pfi++) {
    for (i = 0; i < 2; i++) {
      int flags = 0;

      if (subsamp == TJSAMP_422 || subsamp == TJSAMP_420 ||
          subsamp == TJSAMP_440 || subsamp == TJSAMP_411)
        flags |= TJFLAG_FASTUPSAMPLE;
      if (i == 1) flags |= TJFLAG_BOTTOMUP;
      pf = formats[pfi];
      compTest(chandle, &dstBuf, &size, w, h, pf, basename, subsamp, 100,
               flags);
      decompTest(dhandle, dstBuf, size, w, h, pf, basename, subsamp, flags);
      if (pf >= TJPF_RGBX && pf <= TJPF_XRGB) {
        printf("\n");
        decompTest(dhandle, dstBuf, size, w, h, pf + (TJPF_RGBA - TJPF_RGBX),
                   basename, subsamp, flags);
      }
      printf("\n");
    }
  }
  printf("--------------------\n\n");

bailout:
  if (chandle) tjDestroy(chandle);
  if (dhandle) tjDestroy(dhandle);
  tjFree(dstBuf);
}